

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

void djb::brdf::hd_to_io(vec3 *wh,vec3 *wd,vec3 *wi,vec3 *wo)

{
  float fVar1;
  vec3 vVar2;
  float_t phi_h;
  float_t theta_h;
  vec3 z;
  vec3 y;
  float_t local_7c;
  vec3 *local_78;
  float_t local_6c;
  vec3 local_68;
  vec3 local_58;
  vec3 local_48;
  vec3 local_3c;
  
  local_3c.x = 0.0;
  local_3c.y = 1.0;
  local_3c.z = 0.0;
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_48.z = 1.0;
  local_78 = wo;
  xyz_to_theta_phi(wh,&local_6c,&local_7c);
  local_58 = rotate_vector(wd,&local_3c,local_6c);
  local_68 = rotate_vector(&local_58,&local_48,local_7c);
  vVar2 = normalize(&local_68);
  *wi = vVar2;
  fVar1 = vVar2.z * wh->z + wi->x * wh->x + wi->y * wh->y;
  fVar1 = fVar1 + fVar1;
  local_68.y = wh->y * fVar1 - wi->y;
  local_68.x = wh->x * fVar1 - wi->x;
  local_68.z = fVar1 * wh->z - vVar2.z;
  vVar2 = normalize(&local_68);
  *local_78 = vVar2;
  return;
}

Assistant:

void brdf::hd_to_io(const vec3 &wh, const vec3 &wd, vec3 *wi, vec3 *wo)
{
	const vec3 y = vec3(0, 1, 0);
	const vec3 z = vec3(0, 0, 1);
	float_t theta_h, phi_h;

	xyz_to_theta_phi(wh, &theta_h, &phi_h);
	vec3 tmp = rotate_vector(wd, y, theta_h);
	(*wi) = normalize(rotate_vector(tmp, z, phi_h));
	(*wo) = normalize(2 * dot((*wi), wh) * wh - (*wi));
}